

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O1

TermList Kernel::SubstHelper::
         applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Applicator>
                   (TermList trm,Applicator *applicator,bool noSharing)

{
  TermList TVar1;
  uint uVar2;
  
  uVar2 = (uint)trm._content & 3;
  if (uVar2 == 3) {
    return (TermList)(ulong)((uint)trm._content | 3);
  }
  if (uVar2 == 1) {
    TVar1 = Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::
            Applicator::apply(applicator,(uint)(trm._content >> 2));
    return (TermList)TVar1._content;
  }
  TVar1._content =
       (uint64_t)
       applyImpl<false,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Applicator>
                 (trm._content,applicator,noSharing);
  return (TermList)TVar1._content;
}

Assistant:

TermList SubstHelper::applyImpl(TermList trm, Applicator& applicator, bool noSharing)
{
  using namespace SubstHelper_Aux;

  if(trm.isOrdinaryVar()) {
    return applicator.apply(trm.var());
  }
  else if(trm.isSpecialVar()) {
    return SpecVarHandler<ProcessSpecVars>::apply(applicator, trm.var());
  }
  else {
    ASS(trm.isTerm());
    return TermList(applyImpl<ProcessSpecVars>(trm.term(), applicator, noSharing));
  }
}